

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitCallI(ParseNodeCall *pnodeCall,BOOL fEvaluateComponents,BOOL fIsEval,BOOL fHasNewTarget,
              uint32 actualArgCount,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
              ProfileId callSiteId,AuxArray<unsigned_int> *spreadIndices)

{
  ParseNode *pnode;
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  CallFlags CVar4;
  uint32 byteCount;
  RegSlot RVar5;
  undefined4 *puVar6;
  RegSlot RVar7;
  char cVar8;
  uint uVar9;
  CallFlags callFlags;
  CallIExtendedOptions options;
  OpCode op;
  ArgSlot local_38;
  
  if (0xffff < actualArgCount) {
    Js::Throw::OutOfMemory();
  }
  pnode = pnodeCall->pnodeTarget;
  uVar9 = (byte)pnodeCall->field_0x24 & 8;
  cVar8 = (char)uVar9;
  if ((fEvaluateComponents != 0) && (cVar8 == '\0')) {
    FuncInfo::ReleaseLoc(funcInfo,pnode);
  }
  if (((pnodeCall->super_ParseNode).field_0x1 & 1) != 0) {
    FuncInfo::AcquireLoc(funcInfo,&pnodeCall->super_ParseNode);
  }
  local_38 = (ArgSlot)actualArgCount;
  if (fIsEval == 0) {
    CVar4 = uVar9 >> 3;
    callFlags = CVar4 + (CallFlags_NewTarget|CallFlags_ExtraArg);
    if (fHasNewTarget == 0) {
      callFlags = CVar4;
    }
    uVar3 = pnodeCall->spreadArgCount;
    bVar2 = fHasNewTarget != 0 || cVar8 != '\0';
    op = (ushort)bVar2 + (ushort)(uVar3 != 0) * 2 + CallI;
    if (1 < (byte)(bVar2 + (uVar3 != 0) * '\x02')) goto LAB_0076a925;
    if (cVar8 == '\0') {
      RVar7 = (pnodeCall->super_ParseNode).location;
      RVar5 = pnode->location;
    }
    else {
      RVar5 = ByteCodeGenerator::EmitLdObjProto
                        (byteCodeGenerator,LdFuncObjProto,pnode->location,funcInfo);
      RVar7 = (pnodeCall->super_ParseNode).location;
    }
    Js::ByteCodeWriter::CallI
              (&byteCodeGenerator->m_writer,op,RVar7,RVar5,local_38,callSiteId,callFlags);
    uVar9 = 0;
  }
  else {
    uVar3 = pnodeCall->spreadArgCount;
    callFlags = CallFlags_ExtraArg;
    op = CallIExtendedFlags;
LAB_0076a925:
    if (uVar3 == 0) {
      uVar9 = 0;
      byteCount = 0;
      options = CallIExtended_None;
    }
    else {
      if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2054,"(spreadIndices != nullptr)","spreadIndices != nullptr");
        if (!bVar2) goto LAB_0076ab04;
        *puVar6 = 0;
      }
      if (0x3fffffff < spreadIndices->count) {
        Math::DefaultOverflowPolicy();
      }
      uVar9 = spreadIndices->count << 2;
      byteCount = UInt32Math::Add(4,uVar9);
      options = CallIExtended_SpreadArgs;
    }
    if (cVar8 == '\0') {
      RVar7 = (pnodeCall->super_ParseNode).location;
      RVar5 = pnode->location;
    }
    else {
      RVar5 = ByteCodeGenerator::EmitLdObjProto
                        (byteCodeGenerator,LdFuncObjProto,pnode->location,funcInfo);
      RVar7 = (pnodeCall->super_ParseNode).location;
    }
    Js::ByteCodeWriter::CallIExtended
              (&byteCodeGenerator->m_writer,op,RVar7,RVar5,local_38,options,spreadIndices,byteCount,
               callSiteId,callFlags);
  }
  if (pnodeCall->spreadArgCount == 0) {
    return;
  }
  if (uVar9 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2067,"(spreadExtraAlloc != 0)","spreadExtraAlloc != 0");
    if (!bVar2) {
LAB_0076ab04:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  Memory::
  DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<unsigned_int>>
            (byteCodeGenerator->alloc,spreadIndices,(ulong)uVar9);
  return;
}

Assistant:

void EmitCallI(
    ParseNodeCall *pnodeCall,
    BOOL fEvaluateComponents,
    BOOL fIsEval,
    BOOL fHasNewTarget,
    uint32 actualArgCount,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::AuxArray<uint32> *spreadIndices = nullptr)
{
    // Emit a call where the target is in a register, because it's either a local name or an expression we've
    // already evaluated.

    ParseNode *pnodeTarget = pnodeCall->pnodeTarget;
    Js::OpCode op;
    Js::CallFlags callFlags = Js::CallFlags::CallFlags_None;
    uint spreadExtraAlloc = 0;
    bool isSuperCall = pnodeCall->isSuperCall;

    Js::ArgSlot actualArgSlotCount = (Js::ArgSlot) actualArgCount;

    // check for integer overflow
    if ((size_t)actualArgSlotCount != actualArgCount)
    {
        Js::Throw::OutOfMemory();
    }

    
    if (fEvaluateComponents && !isSuperCall)
    {
        // Release the call target operands we assigned above. If we didn't assign them here,
        // we'll need them later, so we can't re-use them for the result of the call.
        funcInfo->ReleaseLoc(pnodeTarget);
    }
    // Grab a register for the call result.
    if (pnodeCall->isUsed)
    {
        funcInfo->AcquireLoc(pnodeCall);
    }

    if (fIsEval)
    {
        op = Js::OpCode::CallIExtendedFlags;
        callFlags = Js::CallFlags::CallFlags_ExtraArg;
    }
    else
    {
        if (isSuperCall)
        {
            callFlags = Js::CallFlags_New;
        }
        if (fHasNewTarget)
        {
            callFlags = (Js::CallFlags) (callFlags | Js::CallFlags::CallFlags_ExtraArg | Js::CallFlags::CallFlags_NewTarget);
        }

        if (pnodeCall->spreadArgCount > 0)
        {
            op = (isSuperCall || fHasNewTarget) ? Js::OpCode::CallIExtendedFlags : Js::OpCode::CallIExtended;
        }
        else
        {
            op = (isSuperCall || fHasNewTarget) ? Js::OpCode::CallIFlags : Js::OpCode::CallI;
        }
    }

    if (op == Js::OpCode::CallI || op == Js::OpCode::CallIFlags)
    {
        if (isSuperCall)
        {
            Js::RegSlot tmpReg = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdFuncObjProto, pnodeTarget->location, funcInfo);
            byteCodeGenerator->Writer()->CallI(op, pnodeCall->location, tmpReg, actualArgSlotCount, callSiteId, callFlags);
        }
        else
        {
            byteCodeGenerator->Writer()->CallI(op, pnodeCall->location, pnodeTarget->location, actualArgSlotCount, callSiteId, callFlags);
        }
    }
    else
    {
        uint spreadIndicesSize = 0;
        Js::CallIExtendedOptions options = Js::CallIExtended_None;

        if (pnodeCall->spreadArgCount > 0)
        {
            Assert(spreadIndices != nullptr);
            spreadExtraAlloc = UInt32Math::Mul(spreadIndices->count, sizeof(uint32));
            spreadIndicesSize = UInt32Math::Add(sizeof(*spreadIndices), spreadExtraAlloc);
            options = Js::CallIExtended_SpreadArgs;
        }

        if (isSuperCall)
        {
            Js::RegSlot tmpReg = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdFuncObjProto, pnodeTarget->location, funcInfo);
            byteCodeGenerator->Writer()->CallIExtended(op, pnodeCall->location, tmpReg, actualArgSlotCount, options, spreadIndices, spreadIndicesSize, callSiteId, callFlags);
        }
        else
        {
            byteCodeGenerator->Writer()->CallIExtended(op, pnodeCall->location, pnodeTarget->location, actualArgSlotCount, options, spreadIndices, spreadIndicesSize, callSiteId, callFlags);
        }
    }

    if (pnodeCall->spreadArgCount > 0)
    {
        Assert(spreadExtraAlloc != 0);
        AdeletePlus(byteCodeGenerator->GetAllocator(), spreadExtraAlloc, spreadIndices);
    }
}